

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::ConcatenateColumns::dim_forward
          (ConcatenateColumns *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_reference this_00;
  ostream *os;
  invalid_argument *this_01;
  uint *puVar4;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s;
  Dim *d;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *__range1;
  uint bd;
  uint new_cols;
  uint rows;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_fffffffffffffdc8;
  __normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_>
  *in_stack_fffffffffffffdd0;
  ostringstream *this_02;
  Dim *this_03;
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  Dim *local_40;
  Dim *local_38;
  __normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_> local_30;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_28;
  uint local_1c;
  int local_18;
  uint local_14;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  this_03 = in_RDI;
  local_10 = in_RDX;
  sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar3 == 0) {
    __assert_fail("xs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x1e5,
                  "virtual Dim cnn::ConcatenateColumns::dim_forward(const vector<Dim> &) const");
  }
  this_00 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  local_14 = Dim::operator[](this_00,0);
  local_18 = 0;
  local_1c = 1;
  local_28 = local_10;
  local_30._M_current =
       (Dim *)std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::begin(in_stack_fffffffffffffdc8);
  local_38 = (Dim *)std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::end(in_stack_fffffffffffffdc8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffdd0,
                       (__normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_>
                        *)in_stack_fffffffffffffdc8);
    if (!bVar1) {
      x._M_array._4_4_ = local_18;
      x._M_array._0_4_ = local_14;
      x._M_len = (size_type)&stack0xfffffffffffffdf8;
      Dim::Dim(this_03,x,(uint)((ulong)in_RDI >> 0x20));
      return this_03;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_>
               ::operator*(&local_30);
    uVar2 = Dim::operator[](local_40,0);
    if (uVar2 != local_14) break;
    uVar2 = Dim::operator[](local_40,1);
    local_18 = uVar2 + local_18;
    puVar4 = std::max<unsigned_int>(&local_1c,&local_40->bd);
    local_1c = *puVar4;
    __gnu_cxx::
    __normal_iterator<const_cnn::Dim_*,_std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>_>::
    operator++(&local_30);
  }
  this_02 = local_1b8;
  std::__cxx11::ostringstream::ostringstream(this_02);
  os = std::operator<<((ostream *)this_02,"Bad input dimensions in ConcatenateColumns: ");
  cnn::operator<<(os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)this_02);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_01,local_1e8);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim ConcatenateColumns::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() > 0);
  unsigned rows = xs[0][0];
  unsigned new_cols = 0;
  unsigned bd = 1;
  for (auto& d : xs) {
    if (d[0] != rows) {
      ostringstream s; s << "Bad input dimensions in ConcatenateColumns: " << xs;
      throw std::invalid_argument(s.str());
    }
    new_cols += d[1];
    bd = max(bd, d.bd);
  }
  return Dim({rows, new_cols}, bd);
}